

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressBlock_internal
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame)

{
  uint uVar1;
  int iVar2;
  size_t err_code;
  size_t bss;
  BYTE *op;
  BYTE *ip;
  size_t cSize;
  U32 rleMaxLength;
  U32 frame_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx *zc_local;
  
  zc_local = (ZSTD_CCtx *)ZSTD_buildSeqStore(zc,src,srcSize);
  uVar1 = ERR_isError((size_t)zc_local);
  if (uVar1 == 0) {
    if (zc_local == (ZSTD_CCtx *)0x1) {
      ip = (BYTE *)0x0;
    }
    else {
      if ((zc->seqCollector).collectSequences != 0) {
        ZSTD_copyBlockSequences(zc);
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        return 0;
      }
      ip = (BYTE *)ZSTD_entropyCompressSeqStore
                             (&zc->seqStore,&((zc->blockState).prevCBlock)->entropy,
                              &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,dst,
                              dstCapacity,srcSize,zc->entropyWorkspace,0x22d8,zc->bmi2);
      if ((((frame != 0) && (zc->isFirstBlock == 0)) && (ip < (BYTE *)0x19)) &&
         (iVar2 = ZSTD_isRLE((BYTE *)src,srcSize), iVar2 != 0)) {
        ip = (BYTE *)0x1;
        *(undefined1 *)dst = *src;
      }
    }
    uVar1 = ERR_isError((size_t)ip);
    if ((uVar1 == 0) && ((BYTE *)0x1 < ip)) {
      ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
    }
    if ((((zc->blockState).prevCBlock)->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
      (((zc->blockState).prevCBlock)->entropy).fse.offcode_repeatMode = FSE_repeat_check;
    }
    zc_local = (ZSTD_CCtx *)ip;
  }
  return (size_t)zc_local;
}

Assistant:

static size_t
ZSTD_compressBlock_internal(ZSTD_CCtx* zc,
                            void* dst, size_t dstCapacity,
                            const void* src, size_t srcSize, U32 frame)
{
    /* This is an estimated upper bound for the length of an rle block.
     * This isn't the actual upper bound.
     * Finding the real threshold needs further investigation.
     */
    const U32 rleMaxLength = 25;
    size_t cSize;
    const BYTE* ip = (const BYTE*)src;
    BYTE* op = (BYTE*)dst;
    DEBUGLOG(5, "ZSTD_compressBlock_internal (dstCapacity=%u, dictLimit=%u, nextToUpdate=%u)",
                (unsigned)dstCapacity, (unsigned)zc->blockState.matchState.window.dictLimit,
                (unsigned)zc->blockState.matchState.nextToUpdate);

    {   const size_t bss = ZSTD_buildSeqStore(zc, src, srcSize);
        FORWARD_IF_ERROR(bss, "ZSTD_buildSeqStore failed");
        if (bss == ZSTDbss_noCompress) { cSize = 0; goto out; }
    }

    if (zc->seqCollector.collectSequences) {
        ZSTD_copyBlockSequences(zc);
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        return 0;
    }

    /* encode sequences and literals */
    cSize = ZSTD_entropyCompressSeqStore(&zc->seqStore,
            &zc->blockState.prevCBlock->entropy, &zc->blockState.nextCBlock->entropy,
            &zc->appliedParams,
            dst, dstCapacity,
            srcSize,
            zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */,
            zc->bmi2);

    if (frame &&
        /* We don't want to emit our first block as a RLE even if it qualifies because
         * doing so will cause the decoder (cli only) to throw a "should consume all input error."
         * This is only an issue for zstd <= v1.4.3
         */
        !zc->isFirstBlock &&
        cSize < rleMaxLength &&
        ZSTD_isRLE(ip, srcSize))
    {
        cSize = 1;
        op[0] = ip[0];
    }

out:
    if (!ZSTD_isError(cSize) && cSize > 1) {
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
    }
    /* We check that dictionaries have offset codes available for the first
     * block. After the first block, the offcode table might not have large
     * enough codes to represent the offsets in the data.
     */
    if (zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
        zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

    return cSize;
}